

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QRect __thiscall QToolBarAreaLayout::fitLayout(QToolBarAreaLayout *this)

{
  long lVar1;
  int iVar2;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QSize bottom_hint;
  QSize top_hint;
  QSize right_hint;
  QSize left_hint;
  QRect center;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  QToolBarAreaLayoutInfo *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  QRect local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0xf].x2.m_i & 1) == 0) {
    local_18 = *in_RDI;
  }
  else {
    QToolBarAreaLayoutInfo::sizeHint
              ((QToolBarAreaLayoutInfo *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    QToolBarAreaLayoutInfo::sizeHint
              ((QToolBarAreaLayoutInfo *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    QToolBarAreaLayoutInfo::sizeHint
              ((QToolBarAreaLayoutInfo *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    QToolBarAreaLayoutInfo::sizeHint
              ((QToolBarAreaLayoutInfo *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    iVar2 = QSize::width((QSize *)0x6f27b3);
    QSize::height((QSize *)0x6f27c4);
    QSize::width((QSize *)0x6f27d5);
    QSize::height((QSize *)0x6f27ec);
    local_18 = QRect::adjusted((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ),in_stack_ffffffffffffff64,
                               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                               in_stack_ffffffffffffff58);
    QRect::left((QRect *)0x6f2822);
    QRect::top((QRect *)0x6f2830);
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QSize::height((QSize *)0x6f284f);
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff38),in_stack_ffffffffffffff34,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    *(QToolBarAreaLayoutInfo **)(in_RDI + 10) = in_stack_ffffffffffffffb8;
    in_RDI[10].x2 = (Representation)(undefined4)local_40;
    in_RDI[10].y2 = (Representation)local_40._4_4_;
    QRect::left((QRect *)0x6f2893);
    QRect::top((QRect *)0x6f28a4);
    QSize::width((QSize *)0x6f28b5);
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff38),in_stack_ffffffffffffff34,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    in_RDI[3].x1 = (Representation)(undefined4)local_58;
    in_RDI[3].y1 = (Representation)local_58._4_4_;
    in_RDI[3].x2 = (Representation)(undefined4)local_50;
    in_RDI[3].y2 = (Representation)local_50._4_4_;
    QRect::right((QRect *)0x6f290c);
    QRect::top((QRect *)0x6f2920);
    QSize::width((QSize *)0x6f2931);
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff38),in_stack_ffffffffffffff34,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    in_RDI[6].x2 = (Representation)(undefined4)local_68;
    in_RDI[6].y2 = (Representation)local_68._4_4_;
    in_RDI[7].x1 = (Representation)(undefined4)local_60;
    in_RDI[7].y1 = (Representation)local_60._4_4_;
    QRect::left((QRect *)0x6f2977);
    QRect::bottom((QRect *)0x6f2988);
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QSize::height((QSize *)0x6f29aa);
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff38),in_stack_ffffffffffffff34,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    in_RDI[0xd].x2 = (Representation)(undefined4)local_78;
    in_RDI[0xd].y2 = (Representation)local_78._4_4_;
    in_RDI[0xe].x1 = (Representation)(undefined4)local_70;
    in_RDI[0xe].y1 = (Representation)local_70._4_4_;
    QToolBarAreaLayoutInfo::fitLayout(in_stack_ffffffffffffffb8);
    QToolBarAreaLayoutInfo::fitLayout(in_stack_ffffffffffffffb8);
    QToolBarAreaLayoutInfo::fitLayout(in_stack_ffffffffffffffb8);
    QToolBarAreaLayoutInfo::fitLayout(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QRect QToolBarAreaLayout::fitLayout()
{
    if (!visible)
        return rect;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    QRect center = rect.adjusted(left_hint.width(), top_hint.height(),
                                    -right_hint.width(), -bottom_hint.height());

    docks[QInternal::TopDock].rect = QRect(rect.left(), rect.top(),
                                rect.width(), top_hint.height());
    docks[QInternal::LeftDock].rect = QRect(rect.left(), center.top(),
                                left_hint.width(), center.height());
    docks[QInternal::RightDock].rect = QRect(center.right() + 1, center.top(),
                                    right_hint.width(), center.height());
    docks[QInternal::BottomDock].rect = QRect(rect.left(), center.bottom() + 1,
                                    rect.width(), bottom_hint.height());

    docks[QInternal::TopDock].fitLayout();
    docks[QInternal::LeftDock].fitLayout();
    docks[QInternal::RightDock].fitLayout();
    docks[QInternal::BottomDock].fitLayout();

    return center;
}